

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadUnit_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  bool bVar1;
  _Map_pointer ppsVar2;
  ostream *poVar3;
  char *in;
  Logger *pLVar4;
  _Elt_pointer psVar5;
  _Elt_pointer psVar6;
  uint t;
  char *local_1b8 [4];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_198 [376];
  
  if (1 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Unit");
    return;
  }
  LineSplitter::operator++(splitter);
  bVar1 = LineSplitter::match_start(splitter,"Units ");
  if (bVar1) {
    psVar6 = (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar5 = (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppsVar2 = (out->nodes).
              super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    while (psVar6 != (out->nodes).
                     super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      if ((((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_ChunkInfo).id == nfo->parent_id) {
        in = LineSplitter::operator[](splitter,1);
        t = strtoul10(in,(char **)0x0);
        if (t < 8) {
          ((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          unit_scale = units[t];
          return;
        }
        pLVar4 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<unsigned_int>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198
                   ,&t);
        std::operator<<((ostream *)local_198,
                        " is not a valid value for `Units` attribute in `Unit chunk` ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  (local_198,&nfo->id);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar4,local_1b8[0]);
        ((psVar6->super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        unit_scale = 1.0;
        goto LAB_00458a4d;
      }
      psVar6 = psVar6 + 1;
      if (psVar6 == psVar5) {
        psVar6 = ppsVar2[1];
        ppsVar2 = ppsVar2 + 1;
        psVar5 = psVar6 + 0x20;
      }
    }
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[14]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (char (*) [14])0x5bfab1);
    poVar3 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (local_198,&nfo->id);
    std::operator<<(poVar3," is a child of ");
    poVar3 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar3,
                        &nfo->parent_id);
    std::operator<<(poVar3," which does not exist");
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar4,local_1b8[0]);
  }
  else {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[39]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
               (char (*) [39])"Expected `Units` line in `Unit` chunk ");
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
              (local_198,&nfo->id);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar4,local_1b8[0]);
  }
LAB_00458a4d:
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return;
}

Assistant:

void COBImporter::ReadUnit_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Unit");
    }
    ++splitter;
    if (!splitter.match_start("Units ")) {
        ASSIMP_LOG_WARN_F( "Expected `Units` line in `Unit` chunk ", nfo.id);
        return;
    }

    // parent chunks preceede their childs, so we should have the
    // corresponding chunk already.
    for(std::shared_ptr< Node >& nd : out.nodes) {
        if (nd->id == nfo.parent_id) {
            const unsigned int t=strtoul10(splitter[1]);

            nd->unit_scale = t>=sizeof(units)/sizeof(units[0])?(
                ASSIMP_LOG_WARN_F(t, " is not a valid value for `Units` attribute in `Unit chunk` ", nfo.id)
                ,1.f):units[t];
            return;
        }
    }
    ASSIMP_LOG_WARN_F( "`Unit` chunk ", nfo.id, " is a child of ", nfo.parent_id, " which does not exist");
}